

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_blockcb.c
# Opt level: O0

rfc5444_result cb_blocktlv_packet(rfc5444_reader_tlvblock_context *cont,_Bool mandatory_missing)

{
  _Bool local_13;
  _Bool local_12;
  _Bool mandatory_missing_local;
  rfc5444_reader_tlvblock_context *cont_local;
  
  got_tlv[0] = consumer_entries[0].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  local_12 = false;
  if (consumer_entries[0].tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    local_12 = (consumer_entries[0].tlv)->next_entry != (rfc5444_reader_tlvblock_entry *)0x0;
  }
  got_multiple_times[0] = local_12;
  got_tlv[1] = consumer_entries[1].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  local_13 = false;
  if (consumer_entries[1].tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    local_13 = (consumer_entries[1].tlv)->next_entry != (rfc5444_reader_tlvblock_entry *)0x0;
  }
  got_multiple_times[1] = local_13;
  got_failed_constraints = mandatory_missing;
  return RFC5444_OKAY;
}

Assistant:

static enum rfc5444_result
cb_blocktlv_packet(struct rfc5444_reader_tlvblock_context *cont __attribute__ ((unused)),
      bool mandatory_missing) {
  got_tlv[0] = consumer_entries[0].tlv != NULL;
  got_multiple_times[0] = got_tlv[0] && consumer_entries[0].tlv->next_entry != NULL;

  got_tlv[1] = consumer_entries[1].tlv != NULL;
  got_multiple_times[1] = got_tlv[1] && consumer_entries[1].tlv->next_entry != NULL;

  got_failed_constraints = mandatory_missing;
  return RFC5444_OKAY;
}